

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

float ncnn::reduction(float v0,float *ptr,int size0,int size1,int stride1,int op_type)

{
  uint uVar1;
  int j_3;
  ulong uVar2;
  int iVar3;
  float fVar4;
  float local_48;
  
  switch(op_type) {
  case 0:
    uVar1 = 0;
    if (size0 < 1) {
      size0 = uVar1;
    }
    if (size1 < 1) {
      size1 = uVar1;
    }
    for (; uVar1 != size1; uVar1 = uVar1 + 1) {
      for (uVar2 = 0; (uint)size0 != uVar2; uVar2 = uVar2 + 1) {
        v0 = v0 + ptr[uVar2];
      }
      ptr = ptr + stride1;
    }
    break;
  case 1:
    iVar3 = 0;
    if (size0 < 1) {
      size0 = 0;
    }
    if (size1 < 1) {
      size1 = 0;
    }
    for (; iVar3 != size1; iVar3 = iVar3 + 1) {
      for (uVar2 = 0; (uint)size0 != uVar2; uVar2 = uVar2 + 1) {
        v0 = v0 + ABS(ptr[uVar2]);
      }
      ptr = ptr + stride1;
    }
    break;
  case 2:
    iVar3 = 0;
    if (size0 < 1) {
      size0 = 0;
    }
    if (size1 < 1) {
      size1 = 0;
    }
    for (; iVar3 != size1; iVar3 = iVar3 + 1) {
      for (uVar2 = 0; (uint)size0 != uVar2; uVar2 = uVar2 + 1) {
        v0 = v0 + ptr[uVar2] * ptr[uVar2];
      }
      ptr = ptr + stride1;
    }
    break;
  case 3:
  case 7:
  case 8:
  case 9:
    break;
  case 4:
    iVar3 = 0;
    if (size0 < 1) {
      size0 = 0;
    }
    if (size1 < 1) {
      size1 = 0;
    }
    for (; iVar3 != size1; iVar3 = iVar3 + 1) {
      for (uVar2 = 0; (uint)size0 != uVar2; uVar2 = uVar2 + 1) {
        if (v0 <= ptr[uVar2]) {
          v0 = ptr[uVar2];
        }
      }
      ptr = ptr + stride1;
    }
    break;
  case 5:
    iVar3 = 0;
    if (size0 < 1) {
      size0 = 0;
    }
    if (size1 < 1) {
      size1 = 0;
    }
    for (; iVar3 != size1; iVar3 = iVar3 + 1) {
      for (uVar2 = 0; (uint)size0 != uVar2; uVar2 = uVar2 + 1) {
        if (ptr[uVar2] <= v0) {
          v0 = ptr[uVar2];
        }
      }
      ptr = ptr + stride1;
    }
    break;
  case 6:
    iVar3 = 0;
    if (size0 < 1) {
      size0 = 0;
    }
    if (size1 < 1) {
      size1 = 0;
    }
    for (; iVar3 != size1; iVar3 = iVar3 + 1) {
      for (uVar2 = 0; (uint)size0 != uVar2; uVar2 = uVar2 + 1) {
        v0 = v0 * ptr[uVar2];
      }
      ptr = ptr + stride1;
    }
    break;
  case 10:
    iVar3 = 0;
    if (size0 < 1) {
      size0 = 0;
    }
    local_48 = v0;
    if (size1 < 1) {
      size1 = 0;
    }
    for (; v0 = local_48, iVar3 != size1; iVar3 = iVar3 + 1) {
      for (uVar2 = 0; (uint)size0 != uVar2; uVar2 = uVar2 + 1) {
        fVar4 = expf(ptr[uVar2]);
        local_48 = local_48 + fVar4;
      }
      ptr = ptr + stride1;
    }
    break;
  default:
    goto switchD_002f92b7_default;
  }
switchD_002f92b7_default:
  return v0;
}

Assistant:

static float reduction(float v0, const float* ptr, int size0, int size1, int stride1, int op_type)
{
    if (op_type == Reduction::ReductionOp_SUM) return reduction<reduction_op_add>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_ASUM) return reduction<reduction_op_asum>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_SUMSQ) return reduction<reduction_op_sumsq>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_PROD) return reduction<reduction_op_mul>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_MAX) return reduction<reduction_op_max>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_MIN) return reduction<reduction_op_min>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_LogSumExp) return reduction<reduction_op_sumexp>(v0, ptr, size0, size1, stride1);

    // should never reach here
    return v0;
}